

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_push_snapshot(int param_1,int n,cali_id_t *trigger_info_attr_list,
                       cali_variant_t *trigger_info_val_list)

{
  bool bVar1;
  int *piVar2;
  Attribute AVar3;
  size_t n_00;
  SnapshotBuilder *rec;
  reference this;
  ChannelBody *chB;
  SnapshotView trigger_info_00;
  Variant *local_d08;
  Attribute *local_cf0;
  Channel *channel;
  iterator __end1;
  iterator __begin1;
  vector<cali::Channel,_std::allocator<cali::Channel>_> *__range1;
  FixedSizeSnapshotRecord<64UL> trigger_info;
  uint64_t local_678;
  int local_664;
  int local_660;
  int i;
  undefined1 local_658 [8];
  Variant data [64];
  Attribute local_248;
  Attribute attr [64];
  undefined1 local_40 [8];
  Caliper c;
  cali_variant_t *trigger_info_val_list_local;
  cali_id_t *trigger_info_attr_list_local;
  int n_local;
  int param_0_local;
  
  c._24_8_ = trigger_info_val_list;
  trigger_info_attr_list_local._0_4_ = n;
  trigger_info_attr_list_local._4_4_ = param_1;
  cali::Caliper::Caliper((Caliper *)local_40);
  local_cf0 = &local_248;
  do {
    cali::Attribute::Attribute(local_cf0);
    local_cf0 = local_cf0 + 1;
  } while (local_cf0 != attr + 0x3f);
  local_d08 = (Variant *)local_658;
  do {
    cali::Variant::Variant(local_d08);
    local_d08 = local_d08 + 1;
  } while ((anon_union_8_7_33918203_for_value *)local_d08 != &data[0x3f].m_v.value);
  i = 0;
  piVar2 = std::max<int>((int *)&trigger_info_attr_list_local,&i);
  local_660 = 0x40;
  piVar2 = std::min<int>(piVar2,&local_660);
  trigger_info_attr_list_local._0_4_ = *piVar2;
  for (local_664 = 0; local_664 < (int)trigger_info_attr_list_local; local_664 = local_664 + 1) {
    AVar3 = cali::Caliper::get_attribute((Caliper *)local_40,trigger_info_attr_list[local_664]);
    attr[(long)local_664 + -1].m_node = AVar3.m_node;
    cali::Variant::Variant
              ((Variant *)&trigger_info.m_builder.m_skipped,
               (cali_variant_t *)(c._24_8_ + (long)local_664 * 0x10));
    data[(long)local_664 + -1].m_v.value.v_uint = trigger_info.m_builder.m_skipped;
    data[local_664].m_v.type_and_size = local_678;
  }
  cali::FixedSizeSnapshotRecord<64UL>::FixedSizeSnapshotRecord
            ((FixedSizeSnapshotRecord<64UL> *)&__range1);
  n_00 = (size_t)(int)trigger_info_attr_list_local;
  rec = cali::FixedSizeSnapshotRecord<64UL>::builder((FixedSizeSnapshotRecord<64UL> *)&__range1);
  cali::Caliper::make_record
            ((Caliper *)local_40,n_00,&local_248,(Variant *)local_658,rec,(Node *)0x0);
  cali::Caliper::get_all_channels
            ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)&__begin1,(Caliper *)local_40)
  ;
  __end1 = std::vector<cali::Channel,_std::allocator<cali::Channel>_>::begin
                     ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)&__begin1);
  channel = (Channel *)
            std::vector<cali::Channel,_std::allocator<cali::Channel>_>::end
                      ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)&__begin1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
                                     *)&channel), bVar1) {
    this = __gnu_cxx::
           __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
           ::operator*(&__end1);
    bVar1 = cali::Channel::is_active(this);
    if (bVar1) {
      chB = cali::Channel::body(this);
      trigger_info_00 =
           cali::FixedSizeSnapshotRecord<64UL>::view((FixedSizeSnapshotRecord<64UL> *)&__range1);
      cali::Caliper::push_snapshot((Caliper *)local_40,chB,trigger_info_00);
    }
    __gnu_cxx::
    __normal_iterator<cali::Channel_*,_std::vector<cali::Channel,_std::allocator<cali::Channel>_>_>
    ::operator++(&__end1);
  }
  std::vector<cali::Channel,_std::allocator<cali::Channel>_>::~vector
            ((vector<cali::Channel,_std::allocator<cali::Channel>_> *)&__begin1);
  cali::Caliper::~Caliper((Caliper *)local_40);
  return;
}

Assistant:

void cali_push_snapshot(
    int /*scope*/,
    int                  n,
    const cali_id_t      trigger_info_attr_list[],
    const cali_variant_t trigger_info_val_list[]
)
{
    Caliper c;

    Attribute attr[64];
    Variant   data[64];

    n = std::min(std::max(n, 0), 64);

    for (int i = 0; i < n; ++i) {
        attr[i] = c.get_attribute(trigger_info_attr_list[i]);
        data[i] = Variant(trigger_info_val_list[i]);
    }

    FixedSizeSnapshotRecord<64> trigger_info;
    c.make_record(n, attr, data, trigger_info.builder());

    for (auto& channel : c.get_all_channels())
        if (channel.is_active())
            c.push_snapshot(channel.body(), trigger_info.view());
}